

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::giveErrorOnExternalKeyword(StructuralParser *this)

{
  bool bVar1;
  CompileMessage CStack_48;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x297424);
  if (bVar1) {
    Errors::externalOnlyAllowedOnStateVars<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&CStack_48);
    CompileMessage::~CompileMessage(&CStack_48);
  }
  return;
}

Assistant:

void giveErrorOnExternalKeyword()
    {
        if (matches (Keyword::external))
            throwError (Errors::externalOnlyAllowedOnStateVars());
    }